

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  bool bVar1;
  undefined4 in_ECX;
  uint in_ESI;
  ImDrawList *in_RDI;
  int in_R8D;
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  undefined4 in_stack_fffffffffffffe38;
  int iVar2;
  undefined4 in_stack_fffffffffffffe3c;
  ImDrawList *in_stack_fffffffffffffe40;
  ImDrawList *this;
  ImDrawList *uv_max;
  ImVec2 *pIVar3;
  ImVec2 *in_stack_fffffffffffffe68;
  ImVec2 *pIVar4;
  float _y;
  undefined4 in_stack_fffffffffffffe74;
  float _x;
  ImTextureID in_stack_fffffffffffffe78;
  ImVec2 *pIVar5;
  ImDrawList *in_stack_fffffffffffffe80;
  ImDrawList *this_00;
  ImU32 IVar6;
  undefined8 in_stack_fffffffffffffe90;
  ImVec2 *in_stack_fffffffffffffec0;
  ImVec2 *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 uVar7;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [24];
  ImVec2 *local_70;
  ImVec2 local_68 [4];
  ImVec2 IStack_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImFontAtlas *local_30;
  int local_24;
  undefined4 local_20;
  ImDrawList *local_10;
  ImVec2 local_8;
  
  if (in_ESI != 0xffffffff) {
    uVar7 = in_ESI < 9;
    if (!(bool)uVar7) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                    ,0xc9f,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    local_30 = in_RDI->_Data->Font->ContainerAtlas;
    local_24 = in_R8D;
    local_20 = in_ECX;
    local_10 = in_RDI;
    ImVec2::ImVec2(&local_38);
    ImVec2::ImVec2(&local_40);
    pIVar5 = &IStack_48;
    pIVar4 = local_68;
    do {
      pIVar3 = pIVar4;
      ImVec2::ImVec2(pIVar3);
      IVar6 = (ImU32)in_stack_fffffffffffffe90;
      pIVar4 = pIVar3 + 1;
    } while (pIVar4 != pIVar5);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      ((ImFontAtlas *)CONCAT17(uVar7,in_stack_fffffffffffffee8),
                       (ImGuiMouseCursor)((ulong)pIVar4 >> 0x20),pIVar5,pIVar3,
                       in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (bVar1) {
      operator-=(&local_8,&local_38);
      local_70 = (ImVec2 *)local_30->TexID;
      ImDrawList::PushTextureID
                (in_stack_fffffffffffffe40,
                 (ImTextureID)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      this = (ImDrawList *)local_88;
      _y = 0.0;
      uv_max = local_10;
      pIVar3 = local_70;
      ImVec2::ImVec2((ImVec2 *)this,1.0,0.0);
      local_88._8_8_ =
           ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),0.0);
      local_88._16_8_ =
           operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                     (ImVec2 *)0x1ee2d6);
      ImVec2::ImVec2(&local_a8,1.0,_y);
      local_a0 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             ,0.0);
      local_98 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (ImVec2 *)0x1ee331);
      local_b0 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             ,0.0);
      local_90 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (ImVec2 *)0x1ee373);
      iVar2 = local_24;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe74,_y),in_stack_fffffffffffffe68,pIVar3,
                 (ImVec2 *)uv_max,IVar6);
      pIVar4 = &local_c8;
      _x = 2.0;
      this_00 = local_10;
      ImVec2::ImVec2(pIVar4,2.0,_y);
      local_c0 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),0.0);
      local_b8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),(ImVec2 *)0x1ee432);
      pIVar5 = &local_e8;
      ImVec2::ImVec2(pIVar5,_x,_y);
      local_e0 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),0.0);
      local_d8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),(ImVec2 *)0x1ee48d);
      ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),0.0);
      local_d0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,iVar2),(ImVec2 *)0x1ee4c7);
      ImDrawList::AddImage
                (this_00,pIVar5,(ImVec2 *)CONCAT44(_x,_y),pIVar4,pIVar3,(ImVec2 *)uv_max,IVar6);
      IVar6 = (ImU32)local_10;
      ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_24),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_24),(ImVec2 *)0x1ee550);
      ImDrawList::AddImage
                (this_00,pIVar5,(ImVec2 *)CONCAT44(_x,_y),pIVar4,pIVar3,(ImVec2 *)uv_max,IVar6);
      ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_20),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,local_20),(ImVec2 *)0x1ee5df);
      ImDrawList::AddImage
                (this_00,pIVar5,(ImVec2 *)CONCAT44(_x,_y),pIVar4,pIVar3,(ImVec2 *)uv_max,IVar6);
      ImDrawList::PopTextureID(this);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}